

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineComputer::ComputeLinkLibs_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  TargetType TVar1;
  ItemVector *pIVar2;
  OutputFormat output;
  pointer pIVar3;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pIVar2 = cmComputeLinkInformation::GetItems(cli);
  pIVar3 = (pIVar2->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar3 != (pIVar2->
                super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pIVar3->Target == (cmGeneratorTarget *)0x0) {
LAB_003fe18d:
        if (pIVar3->IsPath == true) {
          (*this->_vptr_cmLinkLineComputer[2])(&local_50,this,pIVar3);
          output = (OutputFormat)this->UseWatcomQuote;
          if (this->ForResponse != false) {
            output = RESPONSE;
          }
          cmOutputConverter::ConvertToOutputFormat(&local_70,this->OutputConverter,&local_50,output)
          ;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(pIVar3->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        TVar1 = cmGeneratorTarget::GetType(pIVar3->Target);
        if (TVar1 != INTERFACE_LIBRARY) goto LAB_003fe18d;
      }
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != (pIVar2->
                       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibs(cmComputeLinkInformation& cli)
{
  std::string linkLibs;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (li->Target &&
        li->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (li->IsPath) {
      linkLibs +=
        this->ConvertToOutputFormat(this->ConvertToLinkReference(li->Value));
    } else {
      linkLibs += li->Value;
    }
    linkLibs += " ";
  }
  return linkLibs;
}